

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeIteratorImpl.cpp
# Opt level: O1

DOMNode * __thiscall
xercesc_4_0::DOMNodeIteratorImpl::nextNode
          (DOMNodeIteratorImpl *this,DOMNode *node,bool visitChildren)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DOMNode *pDVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMException *this_00;
  DOMNode *pDVar4;
  bool bVar5;
  undefined4 extraout_var_01;
  
  if (this->fDetached == true) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this->fDocument == (DOMDocument *)0x0) {
      pDVar4 = (DOMNode *)&XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar4 = &this->fDocument[10].super_DOMNode;
    }
    DOMException::DOMException(this_00,0xb,0,(MemoryManager *)pDVar4->_vptr_DOMNode);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  if (node == (DOMNode *)0x0) {
    return this->fRoot;
  }
  if ((visitChildren) &&
     (((this->fExpandEntityReferences != false ||
       (iVar2 = (*node->_vptr_DOMNode[4])(node), iVar2 != 5)) &&
      (iVar2 = (*node->_vptr_DOMNode[0x12])(node), (char)iVar2 != '\0')))) {
    iVar2 = (*node->_vptr_DOMNode[7])(node);
    return (DOMNode *)CONCAT44(extraout_var,iVar2);
  }
  if (this->fRoot != node) {
    iVar2 = (*node->_vptr_DOMNode[10])(node);
    if ((DOMNode *)CONCAT44(extraout_var_00,iVar2) != (DOMNode *)0x0) {
      return (DOMNode *)CONCAT44(extraout_var_00,iVar2);
    }
    iVar2 = (*node->_vptr_DOMNode[5])(node);
    pDVar3 = (DOMNode *)CONCAT44(extraout_var_01,iVar2);
    bVar5 = pDVar3 == this->fRoot;
    bVar1 = bVar5 || pDVar3 == (DOMNode *)0x0;
    pDVar4 = (DOMNode *)0x0;
    if (!bVar5 && pDVar3 != (DOMNode *)0x0) {
      do {
        iVar2 = (*pDVar3->_vptr_DOMNode[10])(pDVar3);
        pDVar4 = (DOMNode *)CONCAT44(extraout_var_02,iVar2);
        if (pDVar4 != (DOMNode *)0x0) break;
        iVar2 = (*pDVar3->_vptr_DOMNode[5])(pDVar3);
        pDVar3 = (DOMNode *)CONCAT44(extraout_var_03,iVar2);
        bVar5 = pDVar3 == this->fRoot;
        bVar1 = bVar5 || pDVar3 == (DOMNode *)0x0;
      } while (!bVar5 && pDVar3 != (DOMNode *)0x0);
    }
    if (!bVar1) {
      return pDVar4;
    }
  }
  return (DOMNode *)0x0;
}

Assistant:

DOMNode* DOMNodeIteratorImpl::nextNode (DOMNode* node, bool visitChildren) {
	if (fDetached)
		throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeIteratorMemoryManager);

    if (!node) return fRoot;

    DOMNode* result = 0;
    // only check children if we visit children.
    if (visitChildren) {
        //if hasChildren, return 1st child.
        if ((fExpandEntityReferences || node->getNodeType()!=DOMNode::ENTITY_REFERENCE_NODE) &&
            node->hasChildNodes()) {
            result = node->getFirstChild();
            return result;
        }
    }

    // if hasSibling, return sibling
    if (node != fRoot) {
        result = node->getNextSibling();
        if (result != 0) return result;


        // return parent's 1st sibling.
        DOMNode* parent = node->getParentNode();
        while ((parent != 0) && parent != fRoot) {
            result = parent->getNextSibling();
            if (result != 0) {
                return result;
            } else {
                parent = parent->getParentNode();
            }

        } // while (parent != 0 && parent != fRoot) {
    }
    // end of list, return 0
    return 0;
}